

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceMemoryProperties2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  TestStatus *pTVar1;
  pointer ppVVar2;
  int iVar3;
  TestError *this_00;
  ulong uVar4;
  RefBase<vk::VkInstance_s_*> local_618;
  TestStatus *local_5f8;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkPhysicalDeviceMemoryProperties2KHR extProperties;
  InstanceDriver vki;
  VkPhysicalDeviceMemoryProperties coreProperties;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)&extProperties,vkp,(char *)context);
  local_618.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)extProperties.memoryProperties._0_8_;
  local_618.m_data.object = (VkInstance_s *)extProperties._0_8_;
  local_618.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)extProperties.pNext;
  extProperties.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  extProperties._4_4_ = 0;
  extProperties.pNext = (void *)0x0;
  extProperties.memoryProperties.memoryTypeCount = 0;
  extProperties.memoryProperties.memoryTypes[0].propertyFlags = 0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase
            ((RefBase<vk::VkInstance_s_*> *)&extProperties);
  ::vk::InstanceDriver::InstanceDriver(&vki,vkp,local_618.m_data.object);
  ::vk::enumeratePhysicalDevices(&devices,&vki.super_InstanceInterface,local_618.m_data.object);
  uVar4 = 0;
  local_5f8 = __return_storage_ptr__;
  while( true ) {
    ppVVar2 = devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extProperties,"Querying device memory properties succeeded",
                 (allocator<char> *)&coreProperties);
      pTVar1 = local_5f8;
      tcu::TestStatus::pass(local_5f8,(string *)&extProperties);
      std::__cxx11::string::~string((string *)&extProperties);
      std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
      ~_Vector_base(&devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   );
      ::vk::InstanceDriver::~InstanceDriver(&vki);
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_618);
      return pTVar1;
    }
    memset(&coreProperties,0xcd,0x208);
    memset(&extProperties,0xcd,0x218);
    extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR;
    extProperties.pNext = (void *)0x0;
    ::vk::InstanceDriver::getPhysicalDeviceMemoryProperties(&vki,ppVVar2[uVar4],&coreProperties);
    ::vk::InstanceDriver::getPhysicalDeviceMemoryProperties2KHR
              (&vki,devices.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4],&extProperties);
    if (extProperties.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR) break;
    if (extProperties.pNext != (void *)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"extProperties.pNext == DE_NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x953);
      goto LAB_00484b7e;
    }
    iVar3 = bcmp(&coreProperties,&extProperties.memoryProperties,0x208);
    if (iVar3 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Mismatch between properties reported by vkGetPhysicalDeviceMemoryProperties and vkGetPhysicalDeviceMemoryProperties2KHR"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x956);
      goto LAB_00484b7e;
    }
    uVar4 = uVar4 + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,
             "extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
             ,0x952);
LAB_00484b7e:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus deviceMemoryProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceMemoryProperties		coreProperties;
		VkPhysicalDeviceMemoryProperties2KHR	extProperties;

		deMemset(&coreProperties, 0xcd, sizeof(VkPhysicalDeviceMemoryProperties));
		deMemset(&extProperties, 0xcd, sizeof(VkPhysicalDeviceMemoryProperties2KHR));

		extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR;
		extProperties.pNext = DE_NULL;

		vki.getPhysicalDeviceMemoryProperties(devices[deviceNdx], &coreProperties);
		vki.getPhysicalDeviceMemoryProperties2KHR(devices[deviceNdx], &extProperties);

		TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR);
		TCU_CHECK(extProperties.pNext == DE_NULL);

		if (deMemCmp(&coreProperties, &extProperties.memoryProperties, sizeof(VkPhysicalDeviceMemoryProperties)) != 0)
			TCU_FAIL("Mismatch between properties reported by vkGetPhysicalDeviceMemoryProperties and vkGetPhysicalDeviceMemoryProperties2KHR");
	}

	return tcu::TestStatus::pass("Querying device memory properties succeeded");
}